

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O2

void __thiscall Amiga::Chipset::update_interrupts(Chipset *this)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  ushort uVar4;
  
  Audio::set_interrupt_requests(&this->audio_,this->interrupt_requests_);
  this->interrupt_level_ = 0;
  uVar1._0_2_ = this->interrupt_enable_;
  uVar1._2_2_ = this->interrupt_requests_;
  uVar3 = this->interrupt_requests_ & (undefined2)uVar1;
  uVar4 = uVar3 & 0x3fff;
  if ((uVar1 >> 0xe & 1) != 0 && uVar4 != 0) {
    if (uVar4 < 0x2000) {
      if (uVar4 < 0x800) {
        if (uVar4 < 0x80) {
          if (uVar4 < 0x10) {
            if (uVar4 < 8) {
              if ((uVar3 & 7) == 0) {
                return;
              }
              iVar2 = 1;
            }
            else {
              iVar2 = 2;
            }
          }
          else {
            iVar2 = 3;
          }
        }
        else {
          iVar2 = 4;
        }
      }
      else {
        iVar2 = 5;
      }
    }
    else {
      iVar2 = 6;
    }
    this->interrupt_level_ = iVar2;
  }
  return;
}

Assistant:

void Chipset::update_interrupts() {
	audio_.set_interrupt_requests(interrupt_requests_);
	interrupt_level_ = 0;

	const uint16_t enabled_requests = interrupt_enable_ & interrupt_requests_ & 0x3fff;
	if(enabled_requests && (interrupt_enable_ & 0x4000)) {
		if(enabled_requests & InterruptFlag::External) {
			interrupt_level_ = 6;
		} else if(enabled_requests & (InterruptFlag::SerialPortReceive | InterruptFlag::DiskSyncMatch)) {
			interrupt_level_ = 5;
		} else if(enabled_requests & (InterruptFlag::AudioChannel0 | InterruptFlag::AudioChannel1 | InterruptFlag::AudioChannel2 | InterruptFlag::AudioChannel3)) {
			interrupt_level_ = 4;
		} else if(enabled_requests & (InterruptFlag::Copper | InterruptFlag::VerticalBlank | InterruptFlag::Blitter)) {
			interrupt_level_ = 3;
		} else if(enabled_requests & InterruptFlag::IOPortsAndTimers) {
			interrupt_level_ = 2;
		} else if(enabled_requests & (InterruptFlag::SerialPortTransmit | InterruptFlag::DiskBlock | InterruptFlag::Software)) {
			interrupt_level_ = 1;
		}
	}
}